

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  cmStateDirectory local_2e0;
  cmStateDirectory local_2b8;
  undefined4 local_28c;
  undefined1 local_288 [8];
  cmGeneratedFileStream infoFileStream;
  undefined1 local_30 [8];
  string infoFileName;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  infoFileName.field_2._8_8_ = this;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_30,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_30,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)local_30,"/CMakeDirectoryInformation.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_288,(string *)local_30,false,None);
  bVar1 = std::ios::operator!((ios *)(local_288 + (long)*(_func_int **)((long)local_288 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_288,true);
    WriteDisclaimer(this,(ostream *)local_288);
    poVar4 = std::operator<<((ostream *)local_288,"# Relative path conversion top directories.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"");
    cmStateSnapshot::GetDirectory
              (&local_2b8,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot
              );
    psVar3 = cmStateDirectory::GetRelativePathTopSource_abi_cxx11_(&local_2b8);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"");
    cmStateSnapshot::GetDirectory
              (&local_2e0,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot
              );
    psVar3 = cmStateDirectory::GetRelativePathTopBinary_abi_cxx11_(&local_2e0);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    std::operator<<(poVar4,"\n");
    bVar2 = cmSystemTools::GetForceUnixPaths();
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)local_288,"# Force unix paths in dependencies.\n");
      poVar4 = std::operator<<(poVar4,"set(CMAKE_FORCE_UNIX_PATHS 1)\n");
      std::operator<<(poVar4,"\n");
    }
    poVar4 = std::operator<<((ostream *)local_288,"\n");
    poVar4 = std::operator<<(poVar4,"# The C and CXX include file regular expressions for ");
    std::operator<<(poVar4,"this directory.\n");
    std::operator<<((ostream *)local_288,"set(CMAKE_C_INCLUDE_REGEX_SCAN ");
    pcVar5 = cmMakefile::GetIncludeRegularExpression
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_288,pcVar5);
    std::operator<<((ostream *)local_288,")\n");
    std::operator<<((ostream *)local_288,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ");
    pcVar5 = cmMakefile::GetComplainRegularExpression
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_288,pcVar5);
    std::operator<<((ostream *)local_288,")\n");
    std::operator<<((ostream *)local_288,
                    "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n");
    std::operator<<((ostream *)local_288,
                    "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n");
    local_28c = 0;
  }
  else {
    local_28c = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName = this->GetCurrentBinaryDirectory();
  infoFileName += "/CMakeFiles";
  infoFileName += "/CMakeDirectoryInformation.cmake";

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName);
  if (!infoFileStream) {
    return;
  }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  /* clang-format off */
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopSource()
    << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopBinary()
    << "\")\n"
    << "\n";
  /* clang-format on */

  // Tell the dependency scanner to use unix paths if necessary.
  if (cmSystemTools::GetForceUnixPaths()) {
    /* clang-format off */
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    /* clang-format on */
  }

  // Store the include regular expressions for this directory.
  infoFileStream << "\n"
                 << "# The C and CXX include file regular expressions for "
                 << "this directory.\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetIncludeRegularExpression());
  infoFileStream << ")\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetComplainRegularExpression());
  infoFileStream << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
                    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}